

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFunctions.h
# Opt level: O0

int Assimp::Math::gcd<int>(int a,int b)

{
  int local_14;
  int zero;
  int b_local;
  int a_local;
  
  local_14 = b;
  zero = a;
  while( true ) {
    if (zero == 0) {
      return local_14;
    }
    local_14 = local_14 % zero;
    if (local_14 == 0) break;
    zero = zero % local_14;
  }
  return zero;
}

Assistant:

inline
IntegerType gcd( IntegerType a, IntegerType b ) {
	const IntegerType zero = (IntegerType)0;
	while ( true ) {
		if ( a == zero )
			return b;
		b %= a;

		if ( b == zero )
			return a;
		a %= b;
	}
}